

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O0

bool __thiscall SQInstance::GetMetaMethod(SQInstance *this,SQVM *v,SQMetaMethod mm,SQObjectPtr *res)

{
  SQObjectPtr *in_RCX;
  uint in_EDX;
  long in_RDI;
  bool bVar1;
  undefined4 in_stack_ffffffffffffffe0;
  
  bVar1 = *(int *)(*(long *)(in_RDI + 0x38) + 0x70 + (ulong)in_EDX * 0x10) != 0x1000001;
  if (bVar1) {
    ::SQObjectPtr::operator=((SQObjectPtr *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_RCX);
  }
  return bVar1;
}

Assistant:

bool SQInstance::GetMetaMethod(SQVM* SQ_UNUSED_ARG(v),SQMetaMethod mm,SQObjectPtr &res)
{
    if(type(_class->_metamethods[mm]) != OT_NULL) {
        res = _class->_metamethods[mm];
        return true;
    }
    return false;
}